

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-pool.cpp
# Opt level: O3

bool __thiscall
MemPool::deleteRecord(MemPool *this,uchar *blkAddress,uint relativeOffset,uint recordSize)

{
  long lVar1;
  int iVar2;
  size_t __len;
  ulong __n;
  undefined8 uStack_30;
  
  this->memPoolUsedRecords = this->memPoolUsedRecords - recordSize;
  if (recordSize != 0) {
    __n = (ulong)recordSize;
    uStack_30 = 0x1183ec;
    memset(blkAddress + relativeOffset,0,__n);
    lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x11840a;
    memset(&stack0xffffffffffffffd8 + lVar1,0,__n);
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x118418;
    iVar2 = bcmp(&stack0xffffffffffffffd8 + lVar1,blkAddress,__n);
    if (iVar2 != 0) {
      return true;
    }
  }
  this->memPoolUsedBlks = this->memPoolUsedBlks - this->blkSize;
  return true;
}

Assistant:

bool MemPool::deleteRecord(uchar *blkAddress, uint relativeOffset, uint recordSize) {
    try {
        // to delete a record, we can change the values stored in that record to NULL
        // traverse from the beginning of the record address to the end based on the size of the record
        // fill the elements to the null character
        memPoolUsedRecords-=recordSize;
        fill(blkAddress+relativeOffset, blkAddress+relativeOffset+recordSize, '\0');

        uchar cmpBlk [recordSize];
        fill(cmpBlk, cmpBlk+recordSize, '\0');

        if(equal(cmpBlk, cmpBlk+recordSize, blkAddress)){
            memPoolUsedBlks-=blkSize;
        }

        return true;
    }

    catch(exception &e) {
        cout << "Exception" <<e.what() << "\n";
        cout << "Delete record or block failed" << "\n";
        return false;
    }
}